

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# superAnd.c
# Opt level: O1

void Super2_Precompute(int nInputs,int nLevels,int fVerbose)

{
  int iVar1;
  undefined8 *__ptr;
  Extra_MmFixed_t *p;
  stmm_table *psVar2;
  Super2_Lib_t *pLib;
  Super2_Gate_t **ppSVar3;
  Super2_Gate_t *pSVar4;
  Super2_Gate_t *pSVar5;
  FILE *__stream;
  char *pcVar6;
  uint uVar7;
  int iVar8;
  long lVar9;
  long lVar10;
  uint uVar11;
  int iVar12;
  ulong uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  Super2_Lib_t *pLib_00;
  timespec ts;
  char **local_b8;
  long local_b0;
  long local_a8;
  ulong local_a0;
  timespec local_98 [6];
  
  if (5 < nInputs) {
    __assert_fail("nInputs < 6",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/super/superAnd.c"
                  ,0x78,"void Super2_Precompute(int, int, int)");
  }
  __ptr = (undefined8 *)malloc(0x18);
  *__ptr = 0;
  __ptr[1] = 0;
  __ptr[2] = 0;
  p = Extra_MmFixedStart(0x20);
  *__ptr = p;
  psVar2 = stmm_init_table(st__ptrcmp,st__ptrhash);
  __ptr[1] = psVar2;
  pLib = (Super2_Lib_t *)malloc(0x30);
  pLib->i = 0;
  pLib->k = 0;
  pLib->nInputs = 0;
  pLib->nMints = 0;
  pLib->nLevels = 0;
  pLib->nGates = 0;
  *(undefined8 *)&pLib->nGatesAlloc = 0;
  pLib->pGates = (Super2_Gate_t **)0x0;
  *(undefined8 *)&pLib->uMaskBit = 0;
  pLib->nInputs = nInputs;
  uVar11 = 1 << ((byte)nInputs & 0x1f);
  pLib->nMints = uVar11;
  pLib->nLevels = 0;
  pLib->nGates = nInputs + 1;
  pLib->nGatesAlloc = nInputs + 1;
  pLib->uMaskBit = 1 << ((char)uVar11 - 1U & 0x1f);
  ppSVar3 = (Super2_Gate_t **)malloc((long)nInputs * 8 + 8);
  pLib->pGates = ppSVar3;
  pSVar4 = (Super2_Gate_t *)Extra_MmFixedEntryFetch(p);
  *ppSVar3 = pSVar4;
  *(undefined8 *)pSVar4 = 0;
  pSVar4->pOne = (Super2_Gate_t *)0x0;
  pSVar4->pTwo = (Super2_Gate_t *)0x0;
  pSVar4->pNext = (Super2_Gate_t *)0x0;
  if (0 < nInputs) {
    pSVar4 = (Super2_Gate_t *)0x0;
    do {
      pSVar5 = (Super2_Gate_t *)Extra_MmFixedEntryFetch(p);
      ppSVar3[(long)((long)&pSVar4->uTruth + 1)] = pSVar5;
      *(undefined8 *)pSVar5 = 0;
      pSVar5->pOne = (Super2_Gate_t *)0x0;
      pSVar5->pTwo = (Super2_Gate_t *)0x0;
      pSVar5->pNext = (Super2_Gate_t *)0x0;
      ppSVar3[(long)((long)&pSVar4->uTruth + 1)]->pTwo = pSVar4;
      pSVar4 = (Super2_Gate_t *)((long)&pSVar4->uTruth + 1);
    } while ((Super2_Gate_t *)(ulong)(uint)nInputs != pSVar4);
  }
  uVar7 = 0;
  do {
    if (0 < nInputs) {
      pSVar4 = (Super2_Gate_t *)0x0;
      do {
        if ((uVar7 >> ((uint)pSVar4 & 0x1f) & 1) != 0) {
          ppSVar3[(long)((long)&pSVar4->uTruth + 1)]->uTruth =
               ppSVar3[(long)((long)&pSVar4->uTruth + 1)]->uTruth | 1 << ((byte)uVar7 & 0x1f);
        }
        pSVar4 = (Super2_Gate_t *)((long)&pSVar4->uTruth + 1);
      } while ((Super2_Gate_t *)(ulong)(uint)nInputs != pSVar4);
    }
    uVar7 = uVar7 + 1;
  } while (uVar7 != uVar11);
  printf("Computing supergates for %d inputs and %d levels:\n",(ulong)(uint)nInputs,
         (ulong)(uint)nLevels);
  if (0 < nLevels) {
    uVar13 = 1;
    pLib_00 = pLib;
    do {
      iVar1 = clock_gettime(3,local_98);
      if (iVar1 < 0) {
        local_b0 = 1;
      }
      else {
        lVar9 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_98[0].tv_nsec),8);
        local_b0 = ((lVar9 >> 7) - (lVar9 >> 0x3f)) + local_98[0].tv_sec * -1000000;
      }
      iVar1 = pLib_00->nMints;
      uVar14 = 0xffffffff >> (-(char)iVar1 & 0x1fU);
      local_a0 = uVar13;
      pLib = (Super2_Lib_t *)malloc(0x30);
      pLib->i = 0;
      pLib->k = 0;
      pLib->nInputs = 0;
      pLib->nMints = 0;
      pLib->nLevels = 0;
      pLib->nGates = 0;
      *(undefined8 *)&pLib->nGatesAlloc = 0;
      pLib->pGates = (Super2_Gate_t **)0x0;
      *(undefined8 *)&pLib->uMaskBit = 0;
      pLib->nInputs = pLib_00->nInputs;
      pLib->nMints = iVar1;
      pLib->nLevels = pLib_00->nLevels;
      uVar11 = pLib_00->nGates;
      lVar9 = (long)(int)uVar11;
      pLib->nGates = uVar11;
      uVar7 = pLib_00->uMaskBit;
      pLib->uMaskBit = uVar7;
      iVar1 = pLib_00->nGatesAlloc;
      pLib->nGatesAlloc = iVar1 + 1000;
      ppSVar3 = (Super2_Gate_t **)malloc((long)iVar1 * 8 + 8000);
      pLib->pGates = ppSVar3;
      memcpy(ppSVar3,pLib_00->pGates,lVar9 * 8);
      stmm_free_table((stmm_table *)__ptr[1]);
      psVar2 = stmm_init_table(st__ptrcmp,st__ptrhash);
      __ptr[1] = psVar2;
      if (lVar9 < 1) {
        iVar1 = 0;
      }
      else {
        uVar13 = 0;
        local_a8 = lVar9;
        do {
          pSVar4 = ppSVar3[uVar13];
          if (pSVar4 == (Super2_Gate_t *)0x0) goto LAB_003e1e53;
          uVar15 = pSVar4->uTruth;
          uVar16 = ~uVar15 & uVar14;
          if ((uVar7 & uVar15) == 0) {
            uVar16 = uVar15;
          }
          iVar1 = stmm_lookup(psVar2,(char *)(ulong)uVar16,(char **)local_98);
          if (iVar1 != 0) {
            pLib->i = (int)uVar13;
            puts("New gate:");
            Super2_LibWriteGate((FILE *)_stdout,pLib,pSVar4);
            puts("Gate in the table:");
            Super2_LibWriteGate((FILE *)_stdout,pLib,(Super2_Gate_t *)local_98[0].tv_sec);
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/super/superAnd.c"
                          ,0x167,"Super2_Lib_t *Super2_LibCompute(Super2_Man_t *, Super2_Lib_t *)");
          }
          stmm_insert(psVar2,(char *)(ulong)uVar16,(char *)pSVar4);
          uVar13 = uVar13 + 1;
        } while (uVar11 != uVar13);
        uVar13 = (ulong)uVar11;
LAB_003e1e53:
        iVar1 = (int)uVar13;
        uVar11 = (uint)local_a8;
      }
      pLib->i = iVar1;
      *(uint *)(__ptr + 2) = uVar11;
      pLib_00->i = 0;
      if (0 < pLib_00->nGates) {
        iVar1 = 0;
        do {
          pSVar4 = pLib_00->pGates[iVar1];
          if (pSVar4 == (Super2_Gate_t *)0x0) break;
          if ((iVar1 != 0) && (iVar1 == (iVar1 / 300) * 300)) {
            printf("Tried %5d first gates...\n");
            fflush(_stdout);
          }
          pLib_00->k = 0;
          iVar1 = pLib_00->i;
          if ((0 < iVar1) &&
             (local_98[0].tv_sec = (__time_t)*pLib_00->pGates,
             (Super2_Gate_t *)local_98[0].tv_sec != (Super2_Gate_t *)0x0)) {
            do {
              uVar11 = pSVar4->uTruth;
              uVar7 = ((Super2_Gate_t *)local_98[0].tv_sec)->uTruth;
              uVar16 = uVar7 & uVar11;
              uVar15 = ~uVar16 & uVar14;
              if ((pLib->uMaskBit & uVar16) == 0) {
                uVar15 = uVar16;
              }
              iVar1 = stmm_find_or_add(psVar2,(char *)(ulong)uVar15,&local_b8);
              if (iVar1 == 0) {
                pSVar5 = (Super2_Gate_t *)Extra_MmFixedEntryFetch(p);
                pSVar5->pOne = pSVar4;
                pSVar5->pTwo = (Super2_Gate_t *)local_98[0].tv_sec;
                pSVar5->uTruth = uVar16;
                *local_b8 = (char *)pSVar5;
                Super2_LibAddGate(pLib,pSVar5);
              }
              uVar16 = ~uVar11 & uVar14 & uVar7;
              uVar15 = pLib->uMaskBit & uVar16;
              if (uVar15 != 0) {
                uVar15 = uVar14;
              }
              iVar1 = stmm_find_or_add(psVar2,(char *)(ulong)(uVar15 ^ uVar16),&local_b8);
              if (iVar1 == 0) {
                pSVar5 = (Super2_Gate_t *)Extra_MmFixedEntryFetch(p);
                pSVar5->pOne = (Super2_Gate_t *)((ulong)pSVar4 ^ 1);
                pSVar5->pTwo = (Super2_Gate_t *)local_98[0].tv_sec;
                pSVar5->uTruth = uVar16;
                *local_b8 = (char *)pSVar5;
                Super2_LibAddGate(pLib,pSVar5);
              }
              uVar16 = uVar11 & uVar14 & ~uVar7;
              uVar15 = pLib->uMaskBit & uVar16;
              if (uVar15 != 0) {
                uVar15 = uVar14;
              }
              iVar1 = stmm_find_or_add(psVar2,(char *)(ulong)(uVar15 ^ uVar16),&local_b8);
              if (iVar1 == 0) {
                pSVar5 = (Super2_Gate_t *)Extra_MmFixedEntryFetch(p);
                pSVar5->pOne = pSVar4;
                pSVar5->pTwo = (Super2_Gate_t *)(local_98[0].tv_sec ^ 1);
                pSVar5->uTruth = uVar16;
                *local_b8 = (char *)pSVar5;
                Super2_LibAddGate(pLib,pSVar5);
              }
              uVar7 = ~uVar11 & uVar14 & ~uVar7;
              uVar11 = pLib->uMaskBit & uVar7;
              if (uVar11 != 0) {
                uVar11 = uVar14;
              }
              iVar1 = stmm_find_or_add(psVar2,(char *)(ulong)(uVar11 ^ uVar7),&local_b8);
              if (iVar1 == 0) {
                pSVar5 = (Super2_Gate_t *)Extra_MmFixedEntryFetch(p);
                pSVar5->pOne = (Super2_Gate_t *)((ulong)pSVar4 ^ 1);
                pSVar5->pTwo = (Super2_Gate_t *)(local_98[0].tv_sec ^ 1);
                pSVar5->uTruth = uVar7;
                *local_b8 = (char *)pSVar5;
                Super2_LibAddGate(pLib,pSVar5);
              }
              *(int *)(__ptr + 2) = *(int *)(__ptr + 2) + 4;
              iVar12 = pLib_00->k;
              iVar8 = iVar12 + 1;
              pLib_00->k = iVar8;
              iVar1 = pLib_00->i;
            } while ((iVar8 < iVar1) &&
                    (local_98[0].tv_sec = (__time_t)pLib_00->pGates[(long)iVar12 + 1],
                    (Super2_Gate_t *)local_98[0].tv_sec != (Super2_Gate_t *)0x0));
          }
          iVar1 = iVar1 + 1;
          pLib_00->i = iVar1;
        } while (iVar1 < pLib_00->nGates);
      }
      uVar13 = local_a0;
      iVar12 = (int)local_a0;
      pLib->nLevels = iVar12;
      Super2_LibStop(pLib_00);
      iVar1 = 0x977868;
      printf("Level %d:  Tried = %7d.  Computed = %7d.  ",uVar13 & 0xffffffff,
             (ulong)*(uint *)(__ptr + 2));
      Abc_Print(iVar1,"%s =","Runtime");
      iVar8 = 3;
      iVar1 = clock_gettime(3,local_98);
      if (iVar1 < 0) {
        lVar9 = -1;
      }
      else {
        lVar9 = local_98[0].tv_nsec / 1000 + local_98[0].tv_sec * 1000000;
      }
      Abc_Print(iVar8,"%9.2f sec\n",(double)(lVar9 + local_b0) / 1000000.0);
      fflush(_stdout);
      uVar13 = (ulong)(iVar12 + 1);
      pLib_00 = pLib;
    } while (iVar12 != nLevels);
  }
  puts("Writing the output file...");
  fflush(_stdout);
  if (pLib->nLevels < 6) {
    iVar1 = clock_gettime(3,local_98);
    if (iVar1 < 0) {
      lVar9 = 1;
    }
    else {
      lVar9 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_98[0].tv_nsec),8);
      lVar9 = ((lVar9 >> 7) - (lVar9 >> 0x3f)) + local_98[0].tv_sec * -1000000;
    }
    s_uMaskBit = pLib->uMaskBit;
    s_uMaskAll = 0xffffffff >> (-(char)pLib->nMints & 0x1fU);
    qsort(pLib->pGates,(long)pLib->nGates,8,Super2_LibCompareGates);
    uVar11 = (*pLib->pGates)->uTruth;
    uVar7 = ~uVar11 & s_uMaskAll;
    if ((s_uMaskBit & uVar11) == 0) {
      uVar7 = uVar11;
    }
    uVar11 = pLib->pGates[(long)pLib->nGates + -1]->uTruth;
    uVar14 = ~uVar11 & s_uMaskAll;
    if ((uVar11 & s_uMaskBit) == 0) {
      uVar14 = uVar11;
    }
    if (uVar14 <= uVar7) {
      __assert_fail("Super2_LibCompareGates( pLib->pGates, pLib->pGates + pLib->nGates - 1 ) < 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/super/superAnd.c"
                    ,0x1e0,"void Super2_LibWrite(Super2_Lib_t *)");
    }
    Abc_Print(uVar7,"%s =","Sorting");
    iVar12 = 3;
    iVar1 = clock_gettime(3,local_98);
    if (iVar1 < 0) {
      lVar10 = -1;
    }
    else {
      lVar10 = local_98[0].tv_nsec / 1000 + local_98[0].tv_sec * 1000000;
    }
    Abc_Print(iVar12,"%9.2f sec\n",(double)(lVar10 + lVar9) / 1000000.0);
    iVar1 = 0;
    sprintf((char *)local_98,"superI%dL%d",(ulong)(uint)pLib->nInputs,(ulong)(uint)pLib->nLevels);
    __stream = fopen((char *)local_98,"w");
    pcVar6 = Extra_TimeStamp();
    fprintf(__stream,"# AND2/INV supergates derived on %s.\n",pcVar6);
    fprintf(__stream,"# Command line: \"super2 -i %d -l %d\".\n",(ulong)(uint)pLib->nInputs,
            (ulong)(uint)pLib->nLevels);
    fprintf(__stream,"# The number of inputs     = %6d.\n",(ulong)(uint)pLib->nInputs);
    fprintf(__stream,"# The number of levels     = %6d.\n",(ulong)(uint)pLib->nLevels);
    fprintf(__stream,"# The number of supergates = %6d.\n",(ulong)(uint)pLib->nGates);
    fprintf(__stream,"# The total functions      = %6d.\n",
            (ulong)(uint)(1 << ((char)pLib->nMints - 1U & 0x1f)));
    fputc(10,__stream);
    fprintf(__stream,"%6d\n",(ulong)(uint)pLib->nGates);
    pLib->i = 0;
    if (0 < pLib->nGates) {
      do {
        if (pLib->pGates[iVar1] == (Super2_Gate_t *)0x0) break;
        Super2_LibWriteGate((FILE *)__stream,pLib,pLib->pGates[iVar1]);
        iVar1 = pLib->i + 1;
        pLib->i = iVar1;
      } while (iVar1 < pLib->nGates);
    }
    fclose(__stream);
    printf("The supergates are written into file \"%s\" ",local_98);
    iVar1 = Extra_FileSize((char *)local_98);
    printf("(%0.2f MB).\n",(double)iVar1 * 9.5367431640625e-07);
  }
  else {
    printf("Cannot write file for %d levels.\n");
  }
  Super2_LibStop(pLib);
  Extra_MmFixedStop((Extra_MmFixed_t *)*__ptr);
  stmm_free_table((stmm_table *)__ptr[1]);
  free(__ptr);
  return;
}

Assistant:

void Super2_Precompute( int nInputs, int nLevels, int fVerbose )
{
    Super2_Man_t * pMan;
    Super2_Lib_t * pLibCur, * pLibNext;
    int Level;
    abctime clk;

    assert( nInputs < 6 );

    // start the manager
    pMan = Super2_ManStart();

    // get the starting supergates
    pLibCur = Super2_LibFirst( pMan, nInputs );

    // perform the computation of supergates
printf( "Computing supergates for %d inputs and %d levels:\n", nInputs, nLevels );
    for ( Level = 1; Level <= nLevels; Level++ )
    {
clk = Abc_Clock();
        pLibNext = Super2_LibCompute( pMan, pLibCur );
        pLibNext->nLevels = Level;
        Super2_LibStop( pLibCur );
        pLibCur = pLibNext;
printf( "Level %d:  Tried = %7d.  Computed = %7d.  ", Level, pMan->nTried, pLibCur->nGates );
ABC_PRT( "Runtime", Abc_Clock() - clk );
fflush( stdout );
    }

printf( "Writing the output file...\n" );
fflush( stdout );
    // write them into a file
    Super2_LibWrite( pLibCur );
    Super2_LibStop( pLibCur );

    // stop the manager
    Super2_ManStop( pMan );
}